

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-writer.c
# Opt level: O1

void labpack_write_cstr(labpack_writer_t *writer,char *value)

{
  mpack_error_t error;
  char *pcVar1;
  
  if (writer == (labpack_writer_t *)0x0) {
    __assert_fail("writer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-writer.c"
                  ,0x1b6,"void labpack_write_cstr(labpack_writer_t *, const char *)");
  }
  if (writer->status == LABPACK_STATUS_OK) {
    if (value == (char *)0x0) {
      writer->status = LABPACK_STATUS_ERROR_NULL_VALUE;
      pcVar1 = "The NUL-terminated string value cannot be NULL";
    }
    else {
      mpack_write_cstr(writer->encoder,value);
      error = writer->encoder->error;
      if (error == mpack_ok) {
        return;
      }
      writer->status = LABPACK_STATUS_ERROR_ENCODER;
      pcVar1 = labpack_mpack_error_message(error);
    }
    writer->status_message = pcVar1;
  }
  return;
}

Assistant:

void
labpack_write_cstr(labpack_writer_t* writer, const char* value)
{
    assert(writer);
    if (labpack_writer_is_ok(writer)) {
        if (!value) {
            writer->status = LABPACK_STATUS_ERROR_NULL_VALUE;
            writer->status_message = NULL_CSTR_MESSAGE;
            return;
        }
        mpack_write_cstr(writer->encoder, value);
        labpack_writer_check_encoder(writer);
    }
}